

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

void __thiscall CTemporaryLabelTable::CTemporaryLabelTable(CTemporaryLabelTable *this)

{
  CTemporaryLabelTable *this_local;
  
  std::vector<TemporaryLabel,_std::allocator<TemporaryLabel>_>::vector(&this->labels);
  std::vector<TemporaryLabel,_std::allocator<TemporaryLabel>_>::reserve(&this->labels,0x80);
  this->refresh = 0;
  return;
}

Assistant:

CTemporaryLabelTable::CTemporaryLabelTable() {
	labels.reserve(128);
	refresh = 0;
}